

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O3

int nvrm_get_chipset(gpu_object *obj)

{
  gpu_object **ppgVar1;
  gpu_object *dev;
  
  do {
    dev = obj;
    if (obj != (gpu_object *)0x0) {
      do {
        if (dev->class_ == 0x80) {
          if ((int *)dev->class_data != (int *)0x0) {
            return *dev->class_data;
          }
          goto LAB_002530cb;
        }
        ppgVar1 = &dev->parent_object;
        dev = *ppgVar1;
      } while (*ppgVar1 != (gpu_object *)0x0);
    }
    dev = (gpu_object *)0x0;
LAB_002530cb:
    if (chipset == 0) {
      fprintf(_stdout,
              "ERROR: Can\'t detect chipset, you need to use -m option or regenerate trace with newer mmt (> Sep 7 2014)%s\n"
              ,"");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      demmt_abort();
    }
    nvrm_device_set_chipset(dev,chipset);
  } while( true );
}

Assistant:

int nvrm_get_chipset(struct gpu_object *obj)
{
	struct gpu_object *dev = nvrm_get_device(obj);

	if (dev && dev->class_data)
		return nvrm_dev(dev)->chipset;

	if (chipset) {
		nvrm_device_set_chipset(dev, chipset);
		return nvrm_get_chipset(obj);
	}

	mmt_error("Can't detect chipset, you need to use -m option or regenerate trace with newer mmt (> Sep 7 2014)%s\n", "");
	demmt_abort();
}